

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::outputAggRegTupleString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,
          bitset<7UL> *increasing,size_t stringOffset,bool postLoop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  string *psVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  size_type *psVar10;
  undefined8 *puVar11;
  ulong uVar12;
  ulong uVar13;
  char cVar14;
  undefined8 uVar15;
  ulong uVar16;
  bool bVar17;
  string __str_6;
  string k;
  string __str;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  bitset<7UL> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  CppGenerator *local_48;
  long local_40;
  size_t local_38;
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  local_80 = __return_storage_ptr__;
  local_70 = increasing;
  local_48 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar13 = numOfAggs + 1;
  local_38 = numOfAggs;
  if (uVar13 < 3) {
    if (uVar13 == 0) {
      return local_80;
    }
    local_40 = stringOffset * 3;
    paVar1 = &local_c0.field_2;
    uVar13 = 0;
    do {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      if (postLoop) {
        std::__cxx11::string::_M_construct((ulong)&local_68,(char)local_40);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        puVar9 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_e0._M_string_length = plVar7[1];
        *plVar7 = (long)puVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        uVar16 = idx->indexes[7] + uVar13;
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024e7fc;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024e7fc;
            }
            if (uVar12 < 10000) goto LAB_0024e7fc;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024e7fc:
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_a0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar16);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar15 = local_e0.field_2._M_allocated_capacity;
        }
        uVar16 = CONCAT44(local_a0._M_string_length._4_4_,(uint)local_a0._M_string_length) +
                 local_e0._M_string_length;
        if ((ulong)uVar15 < uVar16) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            uVar15 = local_a0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < uVar16) goto LAB_0024e871;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
        }
        else {
LAB_0024e871:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)local_a0._M_dataplus._M_p);
        }
        local_100 = &local_f0;
        puVar11 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar8[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar8;
        }
        local_f8 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)puVar11 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = plVar7[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_c0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
      }
      else {
        std::__cxx11::string::_M_construct((ulong)&local_68,(char)local_40);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_e0._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        uVar16 = idx->indexes[7] + uVar13;
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024e946;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024e946;
            }
            if (uVar12 < 10000) goto LAB_0024e946;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024e946:
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_a0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar16);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar15 = local_e0.field_2._M_allocated_capacity;
        }
        uVar16 = CONCAT44(local_a0._M_string_length._4_4_,(uint)local_a0._M_string_length) +
                 local_e0._M_string_length;
        if ((ulong)uVar15 < uVar16) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            uVar15 = local_a0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < uVar16) goto LAB_0024e9bb;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
        }
        else {
LAB_0024e9bb:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)local_a0._M_dataplus._M_p);
        }
        local_100 = &local_f0;
        puVar11 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar8[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar8;
        }
        local_f8 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)puVar11 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar8[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_c0._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 1) != 0) {
        uVar16 = (-(ulong)((uint)(local_70->super__Base_bitset<1UL>)._M_w & 1) & uVar13) +
                 idx->indexes[0];
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024eb61;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024eb61;
            }
            if (uVar12 < 10000) goto LAB_0024eb61;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024eb61:
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,uVar16);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2b3ae7);
        local_100 = &local_f0;
        puVar11 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar8[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar8;
        }
        local_f8 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar8[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_c0._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 2) != 0) {
        uVar16 = ((long)((local_70->super__Base_bitset<1UL>)._M_w << 0x3e) >> 0x3f & uVar13) +
                 idx->indexes[1];
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024ed00;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024ed00;
            }
            if (uVar12 < 10000) goto LAB_0024ed00;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024ed00:
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,uVar16);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2b3b01);
        local_100 = &local_f0;
        puVar11 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar8[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar8;
        }
        local_f8 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar8[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_c0._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 4) != 0) {
        uVar16 = ((long)((local_70->super__Base_bitset<1UL>)._M_w << 0x3d) >> 0x3f & uVar13) +
                 idx->indexes[2];
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024ee9f;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024ee9f;
            }
            if (uVar12 < 10000) goto LAB_0024ee9f;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024ee9f:
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,uVar16);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2b3b17);
        local_100 = &local_f0;
        puVar11 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar8[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar8;
        }
        local_f8 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar8[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_c0._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 8) != 0) {
        uVar16 = (local_70->super__Base_bitset<1UL>)._M_w;
        if ((uVar16 & 8) != 0) {
          std::operator<<((ostream *)&std::cerr,"VIEW ID SHOULD NEVER INCREASE!!! \n");
          goto LAB_0025032a;
        }
        uVar16 = ((long)(uVar16 << 0x3b) >> 0x3f & uVar13) + idx->indexes[4];
        std::operator+(&local_68,"aggregates_",local_48->viewName + idx->indexes[3]);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0.field_2._8_8_ = puVar8[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *puVar9;
          local_e0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_e0._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024f0cb;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024f0cb;
            }
            if (uVar12 < 10000) goto LAB_0024f0cb;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024f0cb:
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_a0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar16);
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar15 = local_e0.field_2._M_allocated_capacity;
        }
        uVar16 = CONCAT44(local_a0._M_string_length._4_4_,(uint)local_a0._M_string_length) +
                 local_e0._M_string_length;
        if ((ulong)uVar15 < uVar16) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            uVar15 = local_a0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < uVar16) goto LAB_0024f140;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
        }
        else {
LAB_0024f140:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)local_a0._M_dataplus._M_p);
        }
        local_100 = &local_f0;
        puVar11 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar8[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar8;
        }
        local_f8 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)puVar11 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar8[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_c0._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 0x20) != 0) {
        std::__cxx11::string::append((char *)local_80);
      }
      if (((idx->present).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
        uVar16 = ((long)((local_70->super__Base_bitset<1UL>)._M_w << 0x39) >> 0x3f & uVar13) +
                 idx->indexes[6];
        cVar14 = '\x01';
        if (9 < uVar16) {
          uVar12 = uVar16;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0024f301;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0024f301;
            }
            if (uVar12 < 10000) goto LAB_0024f301;
            bVar17 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar17);
          cVar14 = cVar14 + '\x01';
        }
LAB_0024f301:
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,uVar16);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2b3ae7);
        local_100 = &local_f0;
        puVar11 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar11) {
          local_f0 = *puVar11;
          uStack_e8 = puVar8[3];
        }
        else {
          local_f0 = *puVar11;
          local_100 = (undefined8 *)*puVar8;
        }
        local_f8 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = puVar8[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_c0._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      psVar5 = local_80;
      std::__cxx11::string::pop_back();
      std::__cxx11::string::append((char *)psVar5);
      bVar17 = uVar13 == local_38;
      uVar13 = uVar13 + 1;
      if (bVar17) {
        return local_80;
      }
    } while( true );
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_68,(char)stringOffset * '\x03');
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_68);
  paVar1 = &local_e0.field_2;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_e0.field_2._M_allocated_capacity = *puVar9;
    local_e0.field_2._8_8_ = plVar7[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *puVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar14 = '\x01';
  if (9 < uVar13) {
    uVar16 = uVar13;
    cVar6 = '\x04';
    do {
      cVar14 = cVar6;
      if (uVar16 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0024f4e7;
      }
      if (uVar16 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0024f4e7;
      }
      if (uVar16 < 10000) goto LAB_0024f4e7;
      bVar17 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar6 = cVar14 + '\x04';
    } while (bVar17);
    cVar14 = cVar14 + '\x01';
  }
LAB_0024f4e7:
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_a0,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar13);
  uVar13 = CONCAT44(local_a0._M_string_length._4_4_,(uint)local_a0._M_string_length) +
           local_e0._M_string_length;
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    uVar15 = local_e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < uVar13) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar15 = local_a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < uVar13) goto LAB_0024f551;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
  }
  else {
LAB_0024f551:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0._M_dataplus._M_p);
  }
  local_100 = &local_f0;
  puVar11 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar11) {
    local_f0 = *puVar11;
    uStack_e8 = puVar8[3];
  }
  else {
    local_f0 = *puVar11;
    local_100 = (undefined8 *)*puVar8;
  }
  local_f8 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  paVar2 = &local_c0.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0.field_2._8_8_ = plVar7[3];
    local_c0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  cVar14 = (char)stringOffset * '\x03' + '\x03';
  paVar3 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar3;
  if (!postLoop) {
    std::__cxx11::string::_M_construct((ulong)&local_68,cVar14);
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
    puVar9 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0.field_2._8_8_ = puVar8[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_e0._M_string_length = puVar8[1];
    *puVar8 = puVar9;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    uVar13 = idx->indexes[7];
    cVar14 = '\x01';
    if (9 < uVar13) {
      uVar16 = uVar13;
      cVar6 = '\x04';
      do {
        cVar14 = cVar6;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024f990;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024f990;
        }
        if (uVar16 < 10000) goto LAB_0024f990;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar6 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024f990:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_a0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar13);
    uVar13 = CONCAT44(local_a0._M_string_length._4_4_,(uint)local_a0._M_string_length) +
             local_e0._M_string_length;
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      uVar15 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < uVar13) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar15 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < uVar13) goto LAB_0024f9f9;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
    }
    else {
LAB_0024f9f9:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0._M_dataplus._M_p);
    }
    puVar11 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar8[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar8;
    }
    local_f8 = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_c0.field_2._M_allocated_capacity = *psVar10;
      local_c0.field_2._8_8_ = puVar8[3];
      local_c0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar10;
      local_c0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_c0._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
    goto LAB_0024fac5;
  }
  std::__cxx11::string::_M_construct((ulong)&local_68,cVar14);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
  puVar9 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_e0.field_2._M_allocated_capacity = *puVar9;
    local_e0.field_2._8_8_ = puVar8[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *puVar9;
    local_e0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_e0._M_string_length = puVar8[1];
  *puVar8 = puVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  uVar13 = idx->indexes[7];
  cVar14 = '\x01';
  if (9 < uVar13) {
    uVar16 = uVar13;
    cVar6 = '\x04';
    do {
      cVar14 = cVar6;
      if (uVar16 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0024f854;
      }
      if (uVar16 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0024f854;
      }
      if (uVar16 < 10000) goto LAB_0024f854;
      bVar17 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar6 = cVar14 + '\x04';
    } while (bVar17);
    cVar14 = cVar14 + '\x01';
  }
LAB_0024f854:
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_a0,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar13);
  uVar13 = CONCAT44(local_a0._M_string_length._4_4_,(uint)local_a0._M_string_length) +
           local_e0._M_string_length;
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    uVar15 = local_e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < uVar13) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar15 = local_a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < uVar13) goto LAB_0024f8bd;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_a0,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
  }
  else {
LAB_0024f8bd:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_a0._M_dataplus._M_p);
  }
  puVar11 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar11) {
    local_f0 = *puVar11;
    uStack_e8 = puVar8[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar11;
    local_100 = (undefined8 *)*puVar8;
  }
  local_f8 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0.field_2._8_8_ = puVar8[3];
    local_c0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_c0._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_80,(ulong)local_c0._M_dataplus._M_p);
LAB_0024fac5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 1) != 0) {
    uVar13 = idx->indexes[0];
    cVar14 = '\x01';
    if (9 < uVar13) {
      uVar16 = uVar13;
      cVar6 = '\x04';
      do {
        cVar14 = cVar6;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024fb80;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024fb80;
        }
        if (uVar16 < 10000) goto LAB_0024fb80;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar6 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024fb80:
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar13);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 1) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_e0,"aggregateRegister[",&local_c0);
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar8[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar8;
    }
    local_f8 = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_80,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 2) != 0) {
    uVar13 = idx->indexes[1];
    cVar14 = '\x01';
    if (9 < uVar13) {
      uVar16 = uVar13;
      cVar6 = '\x04';
      do {
        cVar14 = cVar6;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024fcd4;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024fcd4;
        }
        if (uVar16 < 10000) goto LAB_0024fcd4;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar6 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024fcd4:
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar13);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 2) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_e0,"localRegister[",&local_c0);
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar8[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar8;
    }
    local_f8 = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_80,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 4) != 0) {
    uVar13 = idx->indexes[2];
    cVar14 = '\x01';
    if (9 < uVar13) {
      uVar16 = uVar13;
      cVar6 = '\x04';
      do {
        cVar14 = cVar6;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024fe28;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024fe28;
        }
        if (uVar16 < 10000) goto LAB_0024fe28;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar6 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024fe28:
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar13);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 4) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_e0,"viewRegister[",&local_c0);
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar8[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar8;
    }
    local_f8 = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_80,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 8) != 0) {
    if (((local_70->super__Base_bitset<1UL>)._M_w & 8) != 0) {
      std::operator<<((ostream *)&std::cerr,"VIEW ID SHOULD NEVER INCREASE!!! \n");
LAB_0025032a:
      exit(1);
    }
    uVar13 = idx->indexes[4];
    cVar14 = '\x01';
    if (9 < uVar13) {
      uVar16 = uVar13;
      cVar6 = '\x04';
      do {
        cVar14 = cVar6;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_0024ff8d;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_0024ff8d;
        }
        if (uVar16 < 10000) goto LAB_0024ff8d;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar6 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_0024ff8d:
    sVar4 = idx->indexes[3];
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar13);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 0x10) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_a0,"aggregates_",local_48->viewName + sVar4);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_68.field_2._M_allocated_capacity = *psVar10;
      local_68.field_2._8_8_ = plVar7[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar10;
      local_68._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_68._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_c0._M_dataplus._M_p);
    puVar9 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0.field_2._8_8_ = puVar8[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *puVar9;
      local_e0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_e0._M_string_length = puVar8[1];
    *puVar8 = puVar9;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar8[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar8;
    }
    local_f8 = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_80,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 0x20) != 0) {
    std::__cxx11::string::append((char *)local_80);
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
    uVar13 = idx->indexes[6];
    cVar14 = '\x01';
    if (9 < uVar13) {
      uVar16 = uVar13;
      cVar6 = '\x04';
      do {
        cVar14 = cVar6;
        if (uVar16 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_002501f2;
        }
        if (uVar16 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_002501f2;
        }
        if (uVar16 < 10000) goto LAB_002501f2;
        bVar17 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar6 = cVar14 + '\x04';
      } while (bVar17);
      cVar14 = cVar14 + '\x01';
    }
LAB_002501f2:
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar13);
    if (((local_70->super__Base_bitset<1UL>)._M_w & 0x40) != 0) {
      std::__cxx11::string::append((char *)&local_c0);
    }
    std::operator+(&local_e0,"aggregateRegister[",&local_c0);
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    puVar11 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar11) {
      local_f0 = *puVar11;
      uStack_e8 = puVar8[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar11;
      local_100 = (undefined8 *)*puVar8;
    }
    local_f8 = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_80,(ulong)local_100);
    if (local_100 != &local_f0) {
      operator_delete(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  psVar5 = local_80;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((char *)psVar5);
  return local_80;
}

Assistant:

std::string CppGenerator::outputAggRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset, bool postLoop)
{  
    std::string outString = "";
    
    if (numOfAggs+1 > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";

        if (postLoop)
            outString += offset(stringOffset+1)+
                "aggregateRegister["+std::to_string(idx.indexes[7])+"+i] = ";
        else 
            outString += offset(stringOffset+1)+
                "aggregateRegister["+std::to_string(idx.indexes[7])+"+i] += ";

        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            outString +="aggregateRegister["+k+"]*";
        }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            outString +="localRegister["+k+"]*";
        }

        if (idx.present[2])
        {
            std::string k = std::to_string(idx.indexes[2]);
            if (increasing[2])
                k += "+i";
            outString +="viewRegister["+k+"]*";
        }
        if (idx.present[3])
        {
            // TODO: CHECK THAT index 4 is also presenth
            size_t viewID = idx.indexes[3];                
            if (increasing[3])
            {
                ERROR("VIEW ID SHOULD NEVER INCREASE!!! \n");
                exit(1);
            }
            
            std::string aggID = std::to_string(idx.indexes[4]);
            if (increasing[4])
                aggID += "+i";

            outString += "aggregates_"+viewName[viewID]+"["+aggID+"]*";
        }

        if (idx.present[5])
            outString +=  "count*";

        if (idx.present[6])
        {
            std::string k = std::to_string(idx.indexes[6]);            
            if (increasing[6])
                k += "+i";
            outString += "aggregateRegister["+k+"]*";
        }

        outString.pop_back();
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            // We use a mapping to the correct index
            if (postLoop)
                outString += offset(stringOffset)+
                    "aggregateRegister["+std::to_string(idx.indexes[7]+i)+"] = ";
            else
                outString += offset(stringOffset)+
                    "aggregateRegister["+std::to_string(idx.indexes[7]+i)+"] += ";

            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                outString +="aggregateRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                outString +="localRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[2])
            {
                size_t k = idx.indexes[2];
                if (increasing[2])
                    k += i;
                outString +="viewRegister["+std::to_string(k)+"]*";
            }
            if (idx.present[3])
            {
                // TODO: CHECK THAT index 4 is also presenth
                size_t viewID = idx.indexes[3];                
                if (increasing[3])
                {
                    ERROR("VIEW ID SHOULD NEVER INCREASE!!! \n");
                    exit(1);
                }

                size_t aggID = idx.indexes[4];
                if (increasing[4])
                    aggID += i;

                outString += "aggregates_"+viewName[viewID]+"["+
                    std::to_string(aggID)+"]*";
            }

            if (idx.present[5])
                outString +=  "count*";

            if (idx.present[6])
            {
                size_t k = idx.indexes[6];
                if (increasing[6])
                    k += i;
                outString += "aggregateRegister["+std::to_string(k)+"]*";
            }

            outString.pop_back();
            outString += ";\n";
        }
    }

    return outString;
}